

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall httplib::Server::parse_request_line(Server *this,char *s,Request *req)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  size_t sVar1;
  Request *b;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2f8;
  anon_class_16_2_0af4f598 local_230;
  function<void_(const_char_*,_const_char_*)> local_220;
  size_t local_200;
  size_t count_1;
  size_t i;
  _Self local_1e8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1dd;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1dc;
  undefined1 local_1db;
  allocator<char> local_1da;
  allocator<char> local_1d9;
  allocator<char> local_1d8;
  allocator<char> local_1d7;
  allocator<char> local_1d6;
  allocator<char> local_1d5;
  allocator<char> local_1d4;
  allocator<char> local_1d3;
  allocator<char> local_1d2;
  allocator<char> local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  iterator local_88;
  size_type local_80;
  anon_class_16_2_0af4f598 local_68;
  function<void_(const_char_*,_const_char_*)> local_58;
  size_t local_38;
  size_t count;
  size_t len;
  Request *req_local;
  char *s_local;
  Server *this_local;
  
  len = (size_t)req;
  req_local = (Request *)s;
  s_local = (char *)this;
  sVar4 = strlen(s);
  b = req_local;
  if (((sVar4 < 2) || (*(char *)((long)req_local + (sVar4 - 2)) != '\r')) ||
     (*(char *)((long)req_local + (sVar4 - 1)) != '\n')) {
    this_local._7_1_ = false;
  }
  else {
    count = sVar4 - 2;
    local_38 = 0;
    pcVar5 = (char *)((long)req_local + count);
    local_68.count = &local_38;
    local_68.req = (Request *)len;
    std::function<void(char_const*,char_const*)>::
    function<httplib::Server::parse_request_line(char_const*,httplib::Request&)::_lambda(char_const*,char_const*)_1_,void>
              ((function<void(char_const*,char_const*)> *)&local_58,&local_68);
    detail::split((char *)b,pcVar5,' ',&local_58);
    std::function<void_(const_char_*,_const_char_*)>::~function(&local_58);
    if (local_38 == 3) {
      if ((parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_ == '\0') &&
         (iVar3 = __cxa_guard_acquire(&parse_request_line(char_const*,httplib::Request&)::
                                       methods_abi_cxx11_), iVar3 != 0)) {
        local_1db = 1;
        local_1d0 = &local_1c8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"GET",&local_1d1);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_1a8,"HEAD",&local_1d2);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_188,"POST",&local_1d3);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_168,"PUT",&local_1d4);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_148,"DELETE",&local_1d5);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_128,"CONNECT",&local_1d6);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_108,"OPTIONS",&local_1d7);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_e8,"TRACE",&local_1d8);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_c8,"PATCH",&local_1d9);
        local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_a8,"PRI",&local_1da);
        local_1db = 0;
        local_88 = &local_1c8;
        local_80 = 10;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_1dd);
        __l._M_len = local_80;
        __l._M_array = local_88;
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set(&parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_,__l,&local_1dc,
              &local_1dd);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_1dd);
        local_2f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88;
        do {
          local_2f8 = local_2f8 + -1;
          std::__cxx11::string::~string((string *)local_2f8);
        } while (local_2f8 != &local_1c8);
        std::allocator<char>::~allocator(&local_1da);
        std::allocator<char>::~allocator(&local_1d9);
        std::allocator<char>::~allocator(&local_1d8);
        std::allocator<char>::~allocator(&local_1d7);
        std::allocator<char>::~allocator(&local_1d6);
        std::allocator<char>::~allocator(&local_1d5);
        std::allocator<char>::~allocator(&local_1d4);
        std::allocator<char>::~allocator(&local_1d3);
        std::allocator<char>::~allocator(&local_1d2);
        std::allocator<char>::~allocator(&local_1d1);
        __cxa_atexit(std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::~set,&parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_);
      }
      local_1e8._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_,
                  (key_type *)len);
      i = (size_t)std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(&parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_);
      bVar2 = std::operator==(&local_1e8,(_Self *)&i);
      if (bVar2) {
        this_local._7_1_ = false;
      }
      else {
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(len + 0xb8),"HTTP/1.1");
        if ((bVar2) &&
           (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(len + 0xb8),"HTTP/1.0"), bVar2)) {
          this_local._7_1_ = false;
        }
        else {
          for (count_1 = 0; sVar1 = count_1, uVar6 = std::__cxx11::string::size(), sVar1 < uVar6;
              count_1 = count_1 + 1) {
            pcVar5 = (char *)std::__cxx11::string::operator[](len + 0xd8);
            if (*pcVar5 == '#') {
              std::__cxx11::string::erase(len + 0xd8,count_1);
              break;
            }
          }
          local_200 = 0;
          pcVar5 = (char *)std::__cxx11::string::data();
          lVar7 = std::__cxx11::string::data();
          lVar8 = std::__cxx11::string::size();
          local_230.count = &local_200;
          local_230.req = (Request *)len;
          std::function<void(char_const*,char_const*)>::
          function<httplib::Server::parse_request_line(char_const*,httplib::Request&)::_lambda(char_const*,char_const*)_2_,void>
                    ((function<void(char_const*,char_const*)> *)&local_220,&local_230);
          detail::split(pcVar5,(char *)(lVar7 + lVar8),'?',&local_220);
          std::function<void_(const_char_*,_const_char_*)>::~function(&local_220);
          if (local_200 < 3) {
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool Server::parse_request_line(const char *s, Request &req) {
  auto len = strlen(s);
  if (len < 2 || s[len - 2] != '\r' || s[len - 1] != '\n') { return false; }
  len -= 2;

  {
    size_t count = 0;

    detail::split(s, s + len, ' ', [&](const char *b, const char *e) {
      switch (count) {
      case 0: req.method = std::string(b, e); break;
      case 1: req.target = std::string(b, e); break;
      case 2: req.version = std::string(b, e); break;
      default: break;
      }
      count++;
    });

    if (count != 3) { return false; }
  }

  static const std::set<std::string> methods{
      "GET",     "HEAD",    "POST",  "PUT",   "DELETE",
      "CONNECT", "OPTIONS", "TRACE", "PATCH", "PRI"};

  if (methods.find(req.method) == methods.end()) { return false; }

  if (req.version != "HTTP/1.1" && req.version != "HTTP/1.0") { return false; }

  {
    // Skip URL fragment
    for (size_t i = 0; i < req.target.size(); i++) {
      if (req.target[i] == '#') {
        req.target.erase(i);
        break;
      }
    }

    size_t count = 0;

    detail::split(req.target.data(), req.target.data() + req.target.size(), '?',
                  [&](const char *b, const char *e) {
                    switch (count) {
                    case 0:
                      req.path = detail::decode_url(std::string(b, e), false);
                      break;
                    case 1: {
                      if (e - b > 0) {
                        detail::parse_query_text(std::string(b, e), req.params);
                      }
                      break;
                    }
                    default: break;
                    }
                    count++;
                  });

    if (count > 2) { return false; }
  }

  return true;
}